

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O2

bool __thiscall tcu::CasePaths::matches(CasePaths *this,string *caseName,bool allowPrefix)

{
  pointer pbVar1;
  const_iterator pathStart;
  size_type sVar2;
  const_iterator patternStart;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  size_type *psVar6;
  ulong uVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  components;
  
  de::splitString(&components,caseName,'.');
  pbVar1 = (this->m_casePatterns).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(this->m_casePatterns).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
  pathStart._M_current = (caseName->_M_dataplus)._M_p;
  sVar2 = caseName->_M_string_length;
  psVar6 = &pbVar1->_M_string_length;
  uVar3 = 0;
  do {
    uVar5 = uVar3;
    if (uVar7 == uVar5) break;
    patternStart._M_current =
         (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(psVar6 + -1))->
         _M_dataplus)._M_p;
    bVar4 = matchWildcards(patternStart,(const_iterator)(patternStart._M_current + *psVar6),
                           pathStart,(const_iterator)(pathStart._M_current + sVar2),allowPrefix);
    psVar6 = psVar6 + 4;
    uVar3 = uVar5 + 1;
  } while (!bVar4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&components);
  return uVar5 < uVar7;
}

Assistant:

bool CasePaths::matches (const string& caseName, bool allowPrefix) const
{
	const vector<string> components = de::splitString(caseName, '.');

	for (size_t ndx = 0; ndx < m_casePatterns.size(); ++ndx)
	{
#if defined(TCU_HIERARCHICAL_CASEPATHS)
		const vector<string> patternComponents = de::splitString(m_casePatterns[ndx], '.');

		if (patternMatches(patternComponents.begin(), patternComponents.end(),
						   components.begin(), components.end(), allowPrefix))
			return true;
#else
		if (matchWildcards(m_casePatterns[ndx].begin(), m_casePatterns[ndx].end(),
						   caseName.begin(), caseName.end(), allowPrefix))
			return true;
#endif
	}

	return false;
}